

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

size_t __thiscall caffe::EltwiseParameter::ByteSizeLong(EltwiseParameter *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  EltwiseParameter_EltwiseOp value;
  UnknownFieldSet *unknown_fields;
  size_t sVar4;
  int cached_size;
  size_t data_size;
  size_t sStack_38;
  uint count;
  size_t total_size;
  EltwiseParameter *this_local;
  
  sStack_38 = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = EltwiseParameter::unknown_fields(this);
    sStack_38 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar2 = coeff_size(this);
  iVar3 = coeff_size(this);
  sVar4 = google::protobuf::internal::FromIntSize(iVar3);
  sStack_38 = (ulong)uVar2 * 4 + sVar4 + sStack_38;
  if (((this->_has_bits_).has_bits_[0] & 3) != 0) {
    bVar1 = has_operation(this);
    if (bVar1) {
      value = operation(this);
      sVar4 = google::protobuf::internal::WireFormatLite::EnumSize(value);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_stable_prod_grad(this);
    if (bVar1) {
      sStack_38 = sStack_38 + 2;
    }
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_38);
  this->_cached_size_ = iVar3;
  return sStack_38;
}

Assistant:

size_t EltwiseParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.EltwiseParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated float coeff = 2;
  {
    unsigned int count = this->coeff_size();
    size_t data_size = 4UL * count;
    total_size += 1 *
                  ::google::protobuf::internal::FromIntSize(this->coeff_size());
    total_size += data_size;
  }

  if (_has_bits_[0 / 32] & 3u) {
    // optional .caffe.EltwiseParameter.EltwiseOp operation = 1 [default = SUM];
    if (has_operation()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->operation());
    }

    // optional bool stable_prod_grad = 3 [default = true];
    if (has_stable_prod_grad()) {
      total_size += 1 + 1;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}